

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wabt::BlockExprBase<(wabt::ExprType)25>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)25>_>_>
 wabt::MakeUnique<wabt::BlockExprBase<(wabt::ExprType)25>>(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)25>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)25>_>,_true,_true>
  in_RDI;
  Location LStack_38;
  
  puVar1 = (undefined8 *)operator_new(0x118);
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  *(undefined8 *)((long)puVar1 + 0x2c) = 0;
  *(undefined4 *)(puVar1 + 7) = 0x19;
  *puVar1 = &PTR__BlockExprBase_001a0430;
  puVar1[8] = puVar1 + 10;
  puVar1[9] = 0;
  *(undefined1 *)(puVar1 + 10) = 0;
  *(undefined1 *)(puVar1 + 0xc) = 0;
  LStack_38.field_1.field_0.line = 0;
  LStack_38.field_1._4_8_ = 0;
  LStack_38.filename.data_ = (char *)0x0;
  LStack_38.filename.size_._0_4_ = 0;
  LStack_38.filename.size_._4_4_ = 0;
  Var::Var((Var *)(puVar1 + 0xd),0xffffffff,&LStack_38);
  puVar1[0x20] = 0;
  puVar1[0x21] = 0;
  puVar1[0x1e] = 0;
  puVar1[0x1f] = 0;
  puVar1[0x1c] = 0;
  puVar1[0x1d] = 0;
  puVar1[0x1a] = 0;
  puVar1[0x1b] = 0;
  puVar1[0x18] = 0;
  puVar1[0x19] = 0;
  puVar1[0x16] = 0;
  puVar1[0x17] = 0;
  *(undefined4 *)(puVar1 + 0x22) = 0;
  *(undefined8 **)
   in_RDI.
   super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)25>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)25>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)25>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)25>_>_>
   .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)25>_*,_false>._M_head_impl = puVar1;
  return (__uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)25>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)25>_>,_true,_true>
          )(tuple<wabt::BlockExprBase<(wabt::ExprType)25>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)25>_>_>
            )in_RDI.
             super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)25>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)25>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)25>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)25>_>_>
             .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)25>_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}